

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_lrzip.c
# Opt level: O0

int archive_write_lrzip_open(archive_write_filter *f)

{
  int iVar1;
  char *cmd;
  long in_RDI;
  int r;
  archive_string as;
  write_lrzip *data;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  archive_write_filter *f_00;
  archive_string *as_00;
  
  as_00 = *(archive_string **)(in_RDI + 0x40);
  f_00 = (archive_write_filter *)0x0;
  archive_strncat(as_00,(void *)0x0,0);
  cmd = (char *)(ulong)*(uint *)((long)&as_00->length + 4);
  switch(cmd) {
  case (char *)0x0:
    break;
  case (char *)0x1:
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   cmd);
    break;
  case (char *)0x2:
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   cmd);
    break;
  case (char *)0x3:
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   cmd);
    break;
  case (char *)0x4:
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   cmd);
    break;
  case (char *)0x5:
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   cmd);
  }
  if (0 < (int)as_00->length) {
    archive_strcat((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   cmd);
    archive_strappend_char
              ((archive_string *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char)((ulong)cmd >> 0x38));
  }
  iVar1 = __archive_write_program_open
                    (f_00,(archive_write_program_data *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),cmd);
  archive_string_free((archive_string *)0x17ffaf);
  return iVar1;
}

Assistant:

static int
archive_write_lrzip_open(struct archive_write_filter *f)
{
	struct write_lrzip *data = (struct write_lrzip *)f->data;
	struct archive_string as;
	int r;

	archive_string_init(&as);
	archive_strcpy(&as, "lrzip -q");

	/* Specify compression type. */
	switch (data->compression) {
	case lzma:/* default compression */
		break;
	case bzip2:
		archive_strcat(&as, " -b");
		break;
	case gzip:
		archive_strcat(&as, " -g");
		break;
	case lzo:
		archive_strcat(&as, " -l");
		break;
	case none:
		archive_strcat(&as, " -n");
		break;
	case zpaq:
		archive_strcat(&as, " -z");
		break;
	}

	/* Specify compression level. */
	if (data->compression_level > 0) {
		archive_strcat(&as, " -L ");
		archive_strappend_char(&as, '0' + data->compression_level);
	}

	r = __archive_write_program_open(f, data->pdata, as.s);
	archive_string_free(&as);
	return (r);
}